

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::String::FormatIntWidthN_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value,int width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  int width_local;
  int value_local;
  
  ss._388_4_ = SUB84(this,0);
  ss._384_4_ = value;
  std::__cxx11::stringstream::stringstream(local_1a0);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(&ss.field_0x8,_Var1._M_c);
  _Var2 = std::setw(ss._384_4_);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,ss._388_4_);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidthN(int value, int width) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(width) << value;
  return ss.str();
}